

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets_kernel_2.h
# Opt level: O0

int __thiscall dlib::connection::shutdown(connection *this,int __fd,int __how)

{
  int iVar1;
  int temp;
  int local_4;
  
  mutex::lock((mutex *)0x3c856c);
  if ((this->sd & 1U) == 0) {
    this->sd = true;
    iVar1 = ::shutdown(this->connection_socket,2);
    this->sdr = iVar1;
    local_4 = this->sdr;
    mutex::unlock((mutex *)0x3c85c1);
  }
  else {
    mutex::unlock((mutex *)0x3c8585);
    local_4 = this->sdr;
  }
  return local_4;
}

Assistant:

int shutdown (
        ) 
        {
            sd_mutex.lock();
            if (sd)
            {
                sd_mutex.unlock();
                return sdr;
            }
            sd = true;
            sdr = ::shutdown(connection_socket,SHUT_RDWR); 
            int temp = sdr;
            sd_mutex.unlock();            
            return temp;
        }